

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall State::handle(State *this,Event *event)

{
  undefined1 uVar1;
  mapped_type *pmVar2;
  undefined1 *puVar3;
  undefined4 *in_RSI;
  long in_RDI;
  ImGuiKey keyImGui_1;
  ImGuiKey keyImGui;
  ImGuiMouseButton butImGui_1;
  ImGuiMouseButton butImGui;
  value_type *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
  *in_stack_ffffffffffffff00;
  ImVec2 IStack_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  ImGuiKey local_c0;
  undefined4 local_bc;
  undefined1 local_b8;
  ImGuiKey local_b4;
  undefined4 local_b0;
  ImVec2 IStack_ac;
  undefined4 local_a4;
  undefined4 local_a0;
  ImGuiKey local_9c;
  undefined4 local_98;
  undefined1 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  ImVec2 IStack_88;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined1 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  ImVec2 IStack_68;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined1 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  ImVec2 IStack_44;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined1 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  ImVec2 IStack_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  switch(*in_RSI) {
  case 1:
    pmVar2 = std::
             map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
             ::operator[](in_stack_ffffffffffffff00,
                          (key_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
    ;
    std::__cxx11::string::operator=((string *)&pmVar2->ip,(string *)(in_RSI + 10));
    break;
  case 2:
    std::
    map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
    ::erase((map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
             *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
            (key_type *)in_stack_fffffffffffffeb8);
    break;
  case 3:
    if (in_RSI[1] == *(int *)(in_RDI + 0x10)) {
      local_30 = 1;
      local_2c = 0;
      local_28 = 0x285;
      local_24 = 0xffffffff;
      ImVec2::ImVec2(&IStack_20,(float)in_RSI[2],(float)in_RSI[3]);
      local_18 = 0;
      local_14 = 0;
      std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::push_back
                ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
    }
    break;
  case 4:
    if (in_RSI[1] == *(int *)(in_RDI + 0x10)) {
      local_34 = in_RSI[6];
      if (in_RSI[6] == 1) {
        local_34 = 2;
      }
      else if (in_RSI[6] == 2) {
        local_34 = 1;
      }
      local_54 = 2;
      local_50 = 1;
      local_4c = 0x285;
      local_48 = local_34;
      ImVec2::ImVec2(&IStack_44,(float)in_RSI[2],(float)in_RSI[3]);
      local_3c = 0;
      local_38 = 0;
      std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::push_back
                ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
    }
    break;
  case 5:
    if (in_RSI[1] == *(int *)(in_RDI + 0x10)) {
      local_58 = in_RSI[6];
      if (in_RSI[6] == 1) {
        local_58 = 2;
      }
      else if (in_RSI[6] == 2) {
        local_58 = 1;
      }
      local_78 = 2;
      local_74 = 0;
      local_70 = 0x285;
      local_6c = local_58;
      ImVec2::ImVec2(&IStack_68,(float)in_RSI[2],(float)in_RSI[3]);
      local_60 = 0;
      local_5c = 0;
      std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::push_back
                ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
    }
    break;
  case 6:
    if (in_RSI[1] == *(int *)(in_RDI + 0x10)) {
      local_98 = 3;
      local_94 = 0;
      local_90 = 0x285;
      local_8c = 0xffffffff;
      ImVec2::ImVec2(&IStack_88);
      local_80 = local_10[4];
      local_7c = local_10[5];
      std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::push_back
                ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
    }
    break;
  case 7:
    if (in_RSI[1] == *(int *)(in_RDI + 0x10)) {
      std::__cxx11::string::resize(in_RDI + 0x60);
      uVar1 = (undefined1)local_10[7];
      puVar3 = (undefined1 *)std::__cxx11::string::operator[](in_RDI + 0x60);
      *puVar3 = uVar1;
    }
    break;
  case 8:
    if ((in_RSI[1] == *(int *)(in_RDI + 0x10)) && (0 < (int)in_RSI[7])) {
      local_c0 = toImGuiKey(in_RSI[7]);
      ImVec2::ImVec2(&IStack_d0);
      local_c8 = 0;
      local_c4 = 0;
      std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::push_back
                ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
    }
    break;
  case 9:
    if ((in_RSI[1] == *(int *)(in_RDI + 0x10)) && (0 < (int)in_RSI[7])) {
      local_b4 = toImGuiKey(in_RSI[7]);
      local_bc = 0;
      local_b8 = 0;
      local_b0 = 0xffffffff;
      local_9c = local_b4;
      ImVec2::ImVec2(&IStack_ac);
      local_a4 = 0;
      local_a0 = 0;
      std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::push_back
                ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
    }
    break;
  default:
    printf("Unknown input event\n");
  }
  return;
}

Assistant:

void State::handle(ImGuiWS::Event && event) {
    switch (event.type) {
        case ImGuiWS::Event::Connected:
            {
                clients[event.clientId].ip = event.ip;
            }
            break;
        case ImGuiWS::Event::Disconnected:
            {
                clients.erase(event.clientId);
            }
            break;
        case ImGuiWS::Event::MouseMove:
            {
                if (event.clientId == curIdControl) {
                    inputEvents.push_back(InputEvent { InputEvent::Type::EMousePos, false, ImGuiKey_COUNT, -1, { event.mouse_x, event.mouse_y }, 0.0f, 0.0f });
                }
            }
            break;
        case ImGuiWS::Event::MouseDown:
            {
                if (event.clientId == curIdControl) {
                    // map the JS button code to Dear ImGui's button code
                    ImGuiMouseButton butImGui = event.mouse_but;
                    switch (event.mouse_but) {
                        case 1: butImGui = ImGuiMouseButton_Middle; break;
                        case 2: butImGui = ImGuiMouseButton_Right; break;
                    }

                    inputEvents.push_back(InputEvent { InputEvent::Type::EMouseButton, true, ImGuiKey_COUNT, butImGui, { event.mouse_x, event.mouse_y }, 0.0f, 0.0f });
                }
            }
            break;
        case ImGuiWS::Event::MouseUp:
            {
                if (event.clientId == curIdControl) {
                    // map the JS button code to Dear ImGui's button code
                    ImGuiMouseButton butImGui = event.mouse_but;
                    switch (event.mouse_but) {
                        case 1: butImGui = ImGuiMouseButton_Middle; break;
                        case 2: butImGui = ImGuiMouseButton_Right; break;
                    }

                    inputEvents.push_back(InputEvent { InputEvent::Type::EMouseButton, false, ImGuiKey_COUNT, butImGui, { event.mouse_x, event.mouse_y }, 0.0f, 0.0f });
                }
            }
            break;
        case ImGuiWS::Event::MouseWheel:
            {
                if (event.clientId == curIdControl) {
                    inputEvents.push_back(InputEvent { InputEvent::Type::EMouseWheel, false, ImGuiKey_COUNT, -1, { }, event.wheel_x, event.wheel_y });
                }
            }
            break;
        case ImGuiWS::Event::KeyUp:
            {
                if (event.clientId == curIdControl) {
                    if (event.key > 0) {
                        ImGuiKey keyImGui = ::toImGuiKey(event.key);
                        inputEvents.push_back(InputEvent { InputEvent::Type::EKey, false, keyImGui, -1, { }, 0.0f, 0.0f });
                    }
                }
            }
            break;
        case ImGuiWS::Event::KeyDown:
            {
                if (event.clientId == curIdControl) {
                    if (event.key > 0) {
                        ImGuiKey keyImGui = ::toImGuiKey(event.key);
                        inputEvents.push_back(InputEvent { InputEvent::Type::EKey, true, keyImGui, -1, { }, 0.0f, 0.0f });
                    }
                }
            }
            break;
        case ImGuiWS::Event::KeyPress:
            {
                if (event.clientId == curIdControl) {
                    lastAddText.resize(1);
                    lastAddText[0] = event.key;
                }
            }
            break;
        default:
            {
                printf("Unknown input event\n");
            }
    }
}